

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void xcb_keyboard_handle_key(xcb_generic_event_t *event)

{
  uint uVar1;
  char *pcVar2;
  
  uVar1 = (uint)event & 0xff;
  if (uVar1 < 0x6f) {
    if (uVar1 == 9) {
      sighandler((uint)event);
      return;
    }
    if (uVar1 != 0x1c) {
      if (uVar1 != 0x41) {
        return;
      }
      uVar1 = (uint)(animate == 0);
      if (animate == 0) {
        animate = uVar1;
        redisplay = 0;
        return;
      }
      animate = uVar1;
      redisplay = 1;
      return;
    }
    pcVar2 = getenv("NO_TEXTURE");
    if (pcVar2 == (char *)0x0) {
      setenv("NO_TEXTURE","1",1);
    }
    else {
      unsetenv("NO_TEXTURE");
    }
  }
  else {
    switch(uVar1) {
    case 0x6f:
      view_rx = view_rx + 5.0;
      break;
    case 0x70:
      view_tz = view_tz + -5.0;
      break;
    case 0x71:
      view_ry = view_ry + 5.0;
      break;
    case 0x72:
      view_ry = view_ry + -5.0;
      break;
    default:
      return;
    case 0x74:
      view_rx = view_rx + -5.0;
      break;
    case 0x75:
      view_tz = view_tz + 5.0;
    }
  }
  if (animate == 0) {
    redisplay = 0;
    return;
  }
  return;
}

Assistant:

static void xcb_keyboard_handle_key(xcb_generic_event_t *event)
{
  switch (((xcb_key_press_event_t *)event)->detail) {
    case 0x09:
      sighandler(SIGTERM);
      return;
    case 0x41:
      animate = !animate;
      if (animate) {
        redisplay = 1;
      }
      else {
        redisplay = 0;
      }
      return;
    case 0x75:
      view_tz -= -5.0;
      break;
    case 0x70:
      view_tz += -5.0;
      break;
    case 0x74:
      view_rx -= 5.0;
      break;
    case 0x6f:
      view_rx += 5.0;
      break;
    case 0x72:
      view_ry -= 5.0;
      break;
    case 0x71:
      view_ry += 5.0;
      break;
    case 0x1c:
      if (getenv("NO_TEXTURE")) {
        unsetenv("NO_TEXTURE");
      }
      else {
        setenv("NO_TEXTURE", "1", 1);
      }
      break;
    default:
      return;
  }

  if (!animate) {
    redisplay = 1;
  }
}